

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Quadtree.h
# Opt level: O0

void __thiscall
quadtree::
Quadtree<Node_*,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pvigier[P]Quadtree/examples/physics.cpp:64:19),_std::equal_to<Node_*>,_float>
::findAllIntersections
          (Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>
           *this,Node *node,
          vector<std::pair<Node_*,_Node_*>,_std::allocator<std::pair<Node_*,_Node_*>_>_>
          *intersections)

{
  size_t sVar1;
  vector<std::pair<Node_*,_Node_*>,_std::allocator<std::pair<Node_*,_Node_*>_>_> *pvVar2;
  bool bVar3;
  size_type sVar4;
  reference ppNVar5;
  reference __args_1;
  iterator pvVar6;
  pointer *this_00;
  reference value_00;
  pointer pNVar7;
  value_type *child_1;
  iterator __end0_2;
  iterator __begin0_2;
  array<std::unique_ptr<quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node,_std::default_delete<quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node>_>,_4UL>
  *__range3_1;
  Node **value;
  iterator __end0_1;
  iterator __begin0_1;
  vector<Node_*,_std::allocator<Node_*>_> *__range4;
  value_type *child;
  iterator __end0;
  iterator __begin0;
  array<std::unique_ptr<quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node,_std::default_delete<quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node>_>,_4UL>
  *__range3;
  Box<float> local_40;
  ulong local_30;
  size_t j;
  size_t i;
  vector<std::pair<Node_*,_Node_*>,_std::allocator<std::pair<Node_*,_Node_*>_>_>
  *intersections_local;
  Node *node_local;
  Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>
  *this_local;
  
  i = (size_t)intersections;
  intersections_local =
       (vector<std::pair<Node_*,_Node_*>,_std::allocator<std::pair<Node_*,_Node_*>_>_> *)node;
  node_local = (Node *)this;
  for (j = 0; sVar1 = j,
      sVar4 = std::vector<Node_*,_std::allocator<Node_*>_>::size
                        ((vector<Node_*,_std::allocator<Node_*>_> *)
                         &intersections_local[1].
                          super__Vector_base<std::pair<Node_*,_Node_*>,_std::allocator<std::pair<Node_*,_Node_*>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish), sVar1 < sVar4; j = j + 1) {
    for (local_30 = 0; local_30 < j; local_30 = local_30 + 1) {
      ppNVar5 = std::vector<Node_*,_std::allocator<Node_*>_>::operator[]
                          ((vector<Node_*,_std::allocator<Node_*>_> *)
                           &intersections_local[1].
                            super__Vector_base<std::pair<Node_*,_Node_*>,_std::allocator<std::pair<Node_*,_Node_*>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish,j);
      local_40 = anon_class_1_0_00000001_for_mGetBox::operator()
                           ((anon_class_1_0_00000001_for_mGetBox *)&this->field_0x18,*ppNVar5);
      ppNVar5 = std::vector<Node_*,_std::allocator<Node_*>_>::operator[]
                          ((vector<Node_*,_std::allocator<Node_*>_> *)
                           &intersections_local[1].
                            super__Vector_base<std::pair<Node_*,_Node_*>,_std::allocator<std::pair<Node_*,_Node_*>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish,local_30);
      ___range3 = anon_class_1_0_00000001_for_mGetBox::operator()
                            ((anon_class_1_0_00000001_for_mGetBox *)&this->field_0x18,*ppNVar5);
      bVar3 = Box<float>::intersects(&local_40,(Box<float> *)&__range3);
      sVar1 = i;
      if (bVar3) {
        ppNVar5 = std::vector<Node_*,_std::allocator<Node_*>_>::operator[]
                            ((vector<Node_*,_std::allocator<Node_*>_> *)
                             &intersections_local[1].
                              super__Vector_base<std::pair<Node_*,_Node_*>,_std::allocator<std::pair<Node_*,_Node_*>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish,j);
        __args_1 = std::vector<Node_*,_std::allocator<Node_*>_>::operator[]
                             ((vector<Node_*,_std::allocator<Node_*>_> *)
                              &intersections_local[1].
                               super__Vector_base<std::pair<Node_*,_Node_*>,_std::allocator<std::pair<Node_*,_Node_*>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish,local_30);
        std::vector<std::pair<Node*,Node*>,std::allocator<std::pair<Node*,Node*>>>::
        emplace_back<Node*&,Node*&>
                  ((vector<std::pair<Node*,Node*>,std::allocator<std::pair<Node*,Node*>>> *)sVar1,
                   ppNVar5,__args_1);
      }
    }
  }
  bVar3 = isLeaf(this,(Node *)intersections_local);
  pvVar2 = intersections_local;
  if (!bVar3) {
    __end0 = std::
             array<std::unique_ptr<quadtree::Quadtree<Node_*,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pvigier[P]Quadtree/examples/physics.cpp:64:19),_std::equal_to<Node_*>,_float>::Node,_std::default_delete<quadtree::Quadtree<Node_*,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pvigier[P]Quadtree/examples/physics.cpp:64:19),_std::equal_to<Node_*>,_float>::Node>_>,_4UL>
             ::begin((array<std::unique_ptr<quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node,_std::default_delete<quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node>_>,_4UL>
                      *)intersections_local);
    pvVar6 = std::
             array<std::unique_ptr<quadtree::Quadtree<Node_*,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pvigier[P]Quadtree/examples/physics.cpp:64:19),_std::equal_to<Node_*>,_float>::Node,_std::default_delete<quadtree::Quadtree<Node_*,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pvigier[P]Quadtree/examples/physics.cpp:64:19),_std::equal_to<Node_*>,_float>::Node>_>,_4UL>
             ::end((array<std::unique_ptr<quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node,_std::default_delete<quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node>_>,_4UL>
                    *)pvVar2);
    for (; pvVar2 = intersections_local, __end0 != pvVar6; __end0 = __end0 + 1) {
      this_00 = &intersections_local[1].
                 super__Vector_base<std::pair<Node_*,_Node_*>,_std::allocator<std::pair<Node_*,_Node_*>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      __end0_1 = std::vector<Node_*,_std::allocator<Node_*>_>::begin
                           ((vector<Node_*,_std::allocator<Node_*>_> *)this_00);
      value = (Node **)std::vector<Node_*,_std::allocator<Node_*>_>::end
                                 ((vector<Node_*,_std::allocator<Node_*>_> *)this_00);
      while (bVar3 = __gnu_cxx::operator!=
                               (&__end0_1,
                                (__normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>
                                 *)&value), bVar3) {
        value_00 = __gnu_cxx::
                   __normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>::
                   operator*(&__end0_1);
        pNVar7 = std::
                 unique_ptr<quadtree::Quadtree<Node_*,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pvigier[P]Quadtree/examples/physics.cpp:64:19),_std::equal_to<Node_*>,_float>::Node,_std::default_delete<quadtree::Quadtree<Node_*,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pvigier[P]Quadtree/examples/physics.cpp:64:19),_std::equal_to<Node_*>,_float>::Node>_>
                 ::get(__end0);
        findIntersectionsInDescendants
                  (this,pNVar7,value_00,
                   (vector<std::pair<Node_*,_Node_*>,_std::allocator<std::pair<Node_*,_Node_*>_>_> *
                   )i);
        __gnu_cxx::__normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>::
        operator++(&__end0_1);
      }
    }
    __end0_2 = std::
               array<std::unique_ptr<quadtree::Quadtree<Node_*,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pvigier[P]Quadtree/examples/physics.cpp:64:19),_std::equal_to<Node_*>,_float>::Node,_std::default_delete<quadtree::Quadtree<Node_*,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pvigier[P]Quadtree/examples/physics.cpp:64:19),_std::equal_to<Node_*>,_float>::Node>_>,_4UL>
               ::begin((array<std::unique_ptr<quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node,_std::default_delete<quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node>_>,_4UL>
                        *)intersections_local);
    pvVar6 = std::
             array<std::unique_ptr<quadtree::Quadtree<Node_*,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pvigier[P]Quadtree/examples/physics.cpp:64:19),_std::equal_to<Node_*>,_float>::Node,_std::default_delete<quadtree::Quadtree<Node_*,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pvigier[P]Quadtree/examples/physics.cpp:64:19),_std::equal_to<Node_*>,_float>::Node>_>,_4UL>
             ::end((array<std::unique_ptr<quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node,_std::default_delete<quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node>_>,_4UL>
                    *)pvVar2);
    for (; __end0_2 != pvVar6; __end0_2 = __end0_2 + 1) {
      pNVar7 = std::
               unique_ptr<quadtree::Quadtree<Node_*,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pvigier[P]Quadtree/examples/physics.cpp:64:19),_std::equal_to<Node_*>,_float>::Node,_std::default_delete<quadtree::Quadtree<Node_*,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pvigier[P]Quadtree/examples/physics.cpp:64:19),_std::equal_to<Node_*>,_float>::Node>_>
               ::get(__end0_2);
      findAllIntersections
                (this,pNVar7,
                 (vector<std::pair<Node_*,_Node_*>,_std::allocator<std::pair<Node_*,_Node_*>_>_> *)i
                );
    }
  }
  return;
}

Assistant:

void findAllIntersections(Node* node, std::vector<std::pair<T, T>>& intersections) const
    {
        // Find intersections between values stored in this node
        // Make sure to not report the same intersection twice
        for (auto i = std::size_t(0); i < node->values.size(); ++i)
        {
            for (auto j = std::size_t(0); j < i; ++j)
            {
                if (mGetBox(node->values[i]).intersects(mGetBox(node->values[j])))
                    intersections.emplace_back(node->values[i], node->values[j]);
            }
        }
        if (!isLeaf(node))
        {
            // Values in this node can intersect values in descendants
            for (const auto& child : node->children)
            {
                for (const auto& value : node->values)
                    findIntersectionsInDescendants(child.get(), value, intersections);
            }
            // Find intersections in children
            for (const auto& child : node->children)
                findAllIntersections(child.get(), intersections);
        }
    }